

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::HomeArguments(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  ParseNodeFnc *pPVar1;
  ParseNode *pPVar2;
  bool bVar3;
  ParseNodePtr pPVar4;
  ParseNodeVar *pPVar5;
  anon_class_24_3_d3456051 local_58;
  FuncInfo *local_40;
  FuncInfo *funcInfo_local;
  ArgSlot pos;
  
  local_40 = funcInfo;
  bVar3 = ShouldTrackDebuggerMetadata(this);
  if (bVar3) {
    pPVar1 = funcInfo->root;
    local_58.this = this;
    local_58.pos = (ArgSlot *)funcInfo;
    for (pPVar4 = pPVar1->pnodeParams; pPVar4 != (ParseNode *)0x0;
        pPVar4 = ParseNode::GetFormalNext(pPVar4)) {
      HomeArguments::anon_class_16_2_85211fcd::operator()
                ((anon_class_16_2_85211fcd *)&local_58,pPVar4);
    }
    pPVar2 = pPVar1->pnodeRest;
    if (pPVar2 != (ParseNode *)0x0) {
      HomeArguments::anon_class_16_2_85211fcd::operator()
                ((anon_class_16_2_85211fcd *)&local_58,pPVar2);
    }
  }
  if ((funcInfo->field_0xb4 & 8) == 0) {
    local_58.pos = (ArgSlot *)((long)&funcInfo_local + 6);
    funcInfo_local._6_2_ = 1;
    pPVar1 = funcInfo->root;
    local_58.funcInfo = &local_40;
    local_58.this = this;
    for (pPVar4 = pPVar1->pnodeParams; pPVar4 != (ParseNode *)0x0;
        pPVar4 = ParseNode::GetFormalNext(pPVar4)) {
      HomeArguments::anon_class_24_3_d3456051::operator()(&local_58,pPVar4);
    }
    pPVar2 = pPVar1->pnodeRest;
    if (pPVar2 != (ParseNode *)0x0) {
      HomeArguments::anon_class_24_3_d3456051::operator()(&local_58,pPVar2);
    }
  }
  else {
    pPVar2 = funcInfo->root->pnodeRest;
    if ((pPVar2 != (ParseNode *)0x0) && ((byte)(pPVar2->nop + ~knopList) < 3)) {
      pPVar5 = ParseNode::AsParseNodeVar(pPVar2);
      EmitLoadFormalIntoRegister(this,pPVar2,pPVar5->sym->location + 1,funcInfo);
      return;
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::HomeArguments(FuncInfo *funcInfo)
{
    if (ShouldTrackDebuggerMetadata())
    {
        // Add formals to the debugger propertyidcontainer for reg slots
        auto addFormalsToPropertyIdContainer = [this, funcInfo](ParseNode *pnodeFormal)
        {
            if (pnodeFormal->IsVarLetOrConst())
            {
                Symbol* formal = pnodeFormal->AsParseNodeVar()->sym;
                if (!formal->IsInSlot(this, funcInfo))
                {
                    Assert(!formal->GetHasInit());
                    funcInfo->GetParsedFunctionBody()->InsertSymbolToRegSlotList(formal->GetName(), formal->GetLocation(), funcInfo->varRegsCount);
                }
            }
        };

        MapFormals(funcInfo->root, addFormalsToPropertyIdContainer);
    }

    // Transfer formal parameters to their home locations on the local frame.
    if (funcInfo->GetHasArguments())
    {
        ParseNodePtr rest = funcInfo->root->pnodeRest;
        if (rest != nullptr && rest->IsVarLetOrConst())
        {
            // Since we don't have to iterate over arguments here, we'll trust the location to be correct.
            Symbol* sym = rest->AsParseNodeVar()->sym;
            EmitLoadFormalIntoRegister(rest, sym->GetLocation() + 1, funcInfo);
        }

        // The arguments object creation helper does this work for us.
        return;
    }

    Js::ArgSlot pos = 1;
    auto loadFormal = [&](ParseNode *pnodeFormal)
    {
        EmitLoadFormalIntoRegister(pnodeFormal, pos, funcInfo);
        pos++;
    };
    MapFormals(funcInfo->root, loadFormal);
}